

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<VCProjectSingleConfig>::begin(QList<VCProjectSingleConfig> *this)

{
  VCProjectSingleConfig *n;
  QArrayDataPointer<VCProjectSingleConfig> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<VCProjectSingleConfig> *)0x25be89);
  QArrayDataPointer<VCProjectSingleConfig>::operator->(in_RDI);
  n = QArrayDataPointer<VCProjectSingleConfig>::begin
                ((QArrayDataPointer<VCProjectSingleConfig> *)0x25be9a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }